

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid)

{
  bool bVar1;
  QLocaleId localeId;
  QLocaleId QVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  long in_FS_OFFSET;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QVLABase<QLocaleId> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = lid.language_id;
  local_80._0_4_ = lid._0_4_;
  uVar4 = lid.territory_id;
  local_80._4_4_ = CONCAT22(local_80._6_2_,uVar4);
  localeId = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_80);
  local_88._0_4_ = localeId._0_4_;
  local_88._4_4_ = CONCAT22(local_88._6_2_,localeId.territory_id);
  uVar3 = findLocaleIndexById(localeId);
  if (-1 < (long)uVar3) goto LAB_00116fad;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_50.super_QVLABaseBase.a = 6;
  local_50.super_QVLABaseBase.s = 0;
  local_50.super_QVLABaseBase.ptr = &local_78;
  QVarLengthArray<QLocaleId,_6LL>::append
            ((QVarLengthArray<QLocaleId,_6LL> *)local_50.super_QVLABaseBase.ptr,
             (QLocaleId *)&local_88);
  bVar1 = QVLABase<QLocaleId>::contains<QLocaleId>(&local_50,(QLocaleId *)&local_80);
  if (bVar1) {
LAB_00116e44:
    if ((uVar4 != 0) && (uVar5 != 0 || lid.script_id != 0)) {
      local_80._4_4_ = local_80._4_4_ & 0xffff0000;
      QVar2 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_80);
      local_88._0_4_ = QVar2._0_4_;
      local_88._4_4_ = CONCAT22(local_88._6_2_,QVar2.territory_id);
      bVar1 = QVLABase<QLocaleId>::contains<QLocaleId>(&local_50,(QLocaleId *)&local_88);
      if (!bVar1) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_88._4_4_ << 0x20 | (uint6)(uint)local_88));
        if (-1 < (long)uVar3) goto LAB_00116fa3;
        QVarLengthArray<QLocaleId,_6LL>::append
                  ((QVarLengthArray<QLocaleId,_6LL> *)&local_78,(QLocaleId *)&local_88);
      }
      bVar1 = QVLABase<QLocaleId>::contains<QLocaleId>(&local_50,(QLocaleId *)&local_80);
      if (!bVar1) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_80._4_4_ << 0x20 | (uint6)(uint)local_80));
        if (-1 < (long)uVar3) goto LAB_00116fa3;
        QVarLengthArray<QLocaleId,_6LL>::append
                  ((QVarLengthArray<QLocaleId,_6LL> *)&local_78,(QLocaleId *)&local_80);
      }
    }
    if ((uVar4 != 0 || uVar5 != 0) && lid.script_id != 0) {
      local_80._0_4_ = (uint)uVar5;
      local_80._4_4_ = CONCAT22(local_80._6_2_,uVar4);
      QVar2 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_80);
      local_88._0_4_ = QVar2._0_4_;
      local_88._4_4_ = CONCAT22(local_88._6_2_,QVar2.territory_id);
      bVar1 = QVLABase<QLocaleId>::contains<QLocaleId>(&local_50,(QLocaleId *)&local_88);
      if (!bVar1) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_88._4_4_ << 0x20 | (uint6)(uint)local_88));
        if (-1 < (long)uVar3) goto LAB_00116fa3;
        QVarLengthArray<QLocaleId,_6LL>::append
                  ((QVarLengthArray<QLocaleId,_6LL> *)&local_78,(QLocaleId *)&local_88);
      }
      bVar1 = QVLABase<QLocaleId>::contains<QLocaleId>(&local_50,(QLocaleId *)&local_80);
      if (!bVar1) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_80._4_4_ << 0x20 | (uint6)(uint)local_80));
        if (-1 < (long)uVar3) goto LAB_00116fa3;
        QVarLengthArray<QLocaleId,_6LL>::append
                  ((QVarLengthArray<QLocaleId,_6LL> *)&local_78,(QLocaleId *)&local_80);
      }
    }
    uVar3 = (ulong)locale_index[(ulong)(uint6)localeId & 0xffff];
  }
  else {
    uVar3 = findLocaleIndexById((QLocaleId)((uint6)local_80._4_4_ << 0x20 | (uint6)(uint)local_80));
    if ((long)uVar3 < 0) {
      QVarLengthArray<QLocaleId,_6LL>::append
                ((QVarLengthArray<QLocaleId,_6LL> *)&local_78,(QLocaleId *)&local_80);
      goto LAB_00116e44;
    }
  }
LAB_00116fa3:
  QVarLengthArray<QLocaleId,_6LL>::~QVarLengthArray((QVarLengthArray<QLocaleId,_6LL> *)&local_78);
LAB_00116fad:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid) noexcept
{
    QLocaleId localeId = lid;
    QLocaleId likelyId = localeId.withLikelySubtagsAdded();
    const ushort fallback = likelyId.language_id;

    // Try a straight match with the likely data:
    qsizetype index = findLocaleIndexById(likelyId);
    if (index >= 0)
        return index;
    QVarLengthArray<QLocaleId, 6> tried;
    tried.push_back(likelyId);

#define CheckCandidate(id) do { \
        if (!tried.contains(id)) { \
            index = findLocaleIndexById(id); \
            if (index >= 0) \
                return index; \
            tried.push_back(id); \
        } \
    } while (false) // end CheckCandidate

    // No match; try again with raw data:
    CheckCandidate(localeId);

    // No match; try again with likely country for language_script
    if (lid.territory_id && (lid.language_id || lid.script_id)) {
        localeId.territory_id = 0;
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any country
        CheckCandidate(localeId);
    }

    // No match; try again with likely script for language_region
    if (lid.script_id && (lid.language_id || lid.territory_id)) {
        localeId = QLocaleId { lid.language_id, 0, lid.territory_id };
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any script
        CheckCandidate(localeId);
    }
#undef CheckCandidate

    // No match; return base index for initial likely language:
    return locale_index[fallback];
}